

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<float>::TPZFileEqnStorage
          (TPZFileEqnStorage<float> *this,void **vtt,char option,string *name)

{
  uint in_EAX;
  FILE *pFVar1;
  int zero;
  undefined8 uStack_38;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  uStack_38._0_4_ = in_EAX;
  TPZStack<long,_10>::TPZStack(&this->fBlockPos);
  (this->fFileName)._M_dataplus._M_p = (pointer)&(this->fFileName).field_2;
  (this->fFileName)._M_string_length = 0;
  (this->fFileName).field_2._M_local_buf[0] = '\0';
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0x14;
  std::__cxx11::string::_M_assign((string *)&this->fFileName);
  if (option == 'w') {
    pFVar1 = fopen((this->fFileName)._M_dataplus._M_p,"wb");
    this->fIOStream = (FILE *)pFVar1;
    uStack_38 = (ulong)(uint)uStack_38;
    fwrite(&this->fNumHeaders,4,1,pFVar1);
    fwrite((void *)((long)&uStack_38 + 4),4,1,(FILE *)this->fIOStream);
  }
  else if (option == 'r') {
    pFVar1 = fopen((this->fFileName)._M_dataplus._M_p,"rb");
    this->fIOStream = (FILE *)pFVar1;
    fread(&this->fNumHeaders,4,1,pFVar1);
    fread(&this->fNumBlocks,4,1,(FILE *)this->fIOStream);
    ReadBlockPositions(this);
  }
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage(char option, const std::string & name)
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	fFileName = name;
	if(option=='r'){
		fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
		/**
		 *Opens binary files and get initial information
		 *use this information for storage requirements
		 */
		int64_t sizereturn;
		sizereturn = 0;
		sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		ReadBlockPositions();
	}else if(option=='w'){
		fIOStream = fopen(fFileName.c_str(),"wb"); //open for writing
		/**
		 *Writes NumHeaders and NumBlocks information in
		 *the two initial positions on fIOStream
		 */
		int zero = 0;
		fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
		fwrite(&zero,sizeof(int),1,fIOStream);
		//fCurBlockPosition = ftell(fIOStream);
	}
}